

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

mi_page_t *
mi_segments_page_alloc
          (mi_heap_t *heap,mi_page_kind_t page_kind,size_t required,size_t block_size,
          mi_segments_tld_t *tld)

{
  mi_arena_id_t request_arena_id;
  mi_segments_tld_t *tld_00;
  _Bool _Var1;
  _Bool _Var2;
  ulong uVar3;
  mi_page_t *pmVar4;
  mi_segment_t *pmVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  mi_slice_t *slice;
  undefined4 in_register_00000034;
  ulong uVar9;
  ulong uVar10;
  mi_segment_t *segment;
  mi_segment_t *pmVar11;
  mi_heap_t *heap_00;
  bool bVar12;
  mi_arena_field_cursor_t current;
  _Bool local_89;
  mi_heap_t *local_88;
  mi_segments_tld_t *local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  mi_arena_field_cursor_t local_60;
  
  local_68 = CONCAT44(in_register_00000034,page_kind);
  uVar9 = 0xffffffffffff0000;
  uVar8 = local_68 + 0xffff;
  if (0x80000 < local_68) {
    uVar9 = 0xfffffffffff80000;
    uVar8 = local_68 + 0x7ffff;
  }
  local_70 = (uVar8 & uVar9) >> 0x10;
  request_arena_id = heap->arena_id;
  uVar3 = local_70;
  uVar10 = 1;
  local_88 = heap;
  local_80 = (mi_segments_tld_t *)block_size;
  local_78 = required;
  if ((uVar8 & uVar9) < 0x20000) {
LAB_0050af99:
    uVar9 = uVar3 * 0x18;
    do {
      for (slice = *(mi_slice_t **)((long)&local_80->spans[0].first + uVar9);
          slice != (mi_slice_t *)0x0; slice = slice->next) {
        if (uVar10 <= slice->slice_count) {
          pmVar11 = (mi_segment_t *)((ulong)((long)slice[-1].padding + 7U) & 0xfffffffffe000000);
          if ((long)pmVar11 < 1) {
            pmVar11 = (mi_segment_t *)0x0;
          }
          _Var1 = _mi_arena_memid_is_suitable(pmVar11->memid,request_arena_id);
          if (_Var1) {
            mi_span_queue_delete((mi_span_queue_t *)((long)&local_80->spans[0].first + uVar9),slice)
            ;
            uVar9 = (ulong)slice->slice_count;
            if (uVar10 <= uVar9 && uVar9 - uVar10 != 0) {
              tld = local_80;
              mi_segment_span_free
                        (pmVar11,((long)slice + (-0x120 - (long)pmVar11) >> 5) * -0x5555555555555555
                                 + uVar10,uVar9 - uVar10,false,local_80);
              slice->slice_count = (uint32_t)uVar10;
              uVar9 = uVar10;
            }
            pmVar4 = mi_segment_span_allocate
                               (pmVar11,((long)slice + (-0x120 - (long)pmVar11) >> 5) *
                                        -0x5555555555555555,uVar9);
            if (pmVar4 != (mi_page_t *)0x0) {
              pmVar5 = (mi_segment_t *)((ulong)((long)pmVar4[-1].padding + 7) & 0xfffffffffe000000);
              pmVar11 = (mi_segment_t *)0x0;
              if (0 < (long)pmVar5) {
                pmVar11 = pmVar5;
              }
              mi_segment_try_purge(pmVar11,false);
              return pmVar4;
            }
            mi_segment_span_free_coalesce(slice,local_80);
            goto LAB_0050b0a4;
          }
        }
      }
      bVar12 = uVar9 < 0x331;
      uVar9 = uVar9 + 0x18;
    } while (bVar12);
  }
  else {
    uVar9 = local_70 - 1;
    uVar8 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    if (2 < uVar8) {
      uVar3 = ((ulong)((uint)(uVar9 >> (0x3d - ((byte)uVar8 ^ 0x3f) & 0x3f)) & 3) + uVar8 * 4) - 4;
    }
    uVar10 = local_70;
    if (uVar3 < 0x24) goto LAB_0050af99;
  }
LAB_0050b0a4:
  uVar9 = mi_option_get_clamp(mi_option_target_segments_per_thread,0,0x400);
  tld_00 = local_80;
  heap_00 = local_88;
  if ((uVar9 != 0) && (uVar9 <= local_80->count)) {
    mi_segments_try_abandon_to_target(local_88,uVar9,local_80);
  }
  local_89 = false;
  lVar6 = mi_option_get_clamp(mi_option_max_segment_reclaim,0,100);
  if (lVar6 != 0) {
    uVar9 = tld_00->subproc->abandoned_count;
    if (uVar9 != 0) {
      if (uVar9 < 0x2711) {
        uVar8 = (lVar6 * uVar9) / 100;
      }
      else {
        uVar8 = (uVar9 / 100) * lVar6;
      }
      uVar3 = 0x400;
      if (uVar8 < 0x400) {
        uVar3 = uVar8;
      }
      lVar7 = uVar3 + (uVar3 == 0);
      lVar6 = 8;
      if (7 < uVar8) {
        lVar6 = lVar7;
      }
      if (uVar9 < 9) {
        lVar6 = lVar7;
      }
      _mi_arena_field_cursor_init(heap_00,tld_00->subproc,false,&local_60);
      bVar12 = true;
LAB_0050b191:
      do {
        uVar9 = mi_option_get_clamp(mi_option_target_segments_per_thread,0,0x400);
        if (uVar9 == 0) {
          if (0 < lVar6) goto LAB_0050b1c7;
LAB_0050b271:
          bVar12 = true;
          goto LAB_0050b298;
        }
        if ((uVar9 <= tld_00->count) || (lVar6 < 1)) goto LAB_0050b298;
LAB_0050b1c7:
        pmVar11 = _mi_arena_segment_clear_abandoned_next(&local_60);
        if (pmVar11 == (mi_segment_t *)0x0) goto LAB_0050b271;
        pmVar11->abandoned_visits = pmVar11->abandoned_visits + 1;
        _Var1 = _mi_heap_memid_is_suitable(heap_00,pmVar11->memid);
        _Var2 = mi_segment_check_free(pmVar11,local_70,local_78,tld_00);
        heap_00 = local_88;
        if (pmVar11->used == 0) {
LAB_0050b252:
          lVar6 = lVar6 + -1;
          tld = tld_00;
          mi_segment_reclaim(pmVar11,local_88,0,(_Bool *)0x0,tld_00);
          goto LAB_0050b191;
        }
        if (_Var2 && _Var1) goto LAB_0050b275;
        if (3 < pmVar11->abandoned_visits && _Var1) goto LAB_0050b252;
        mi_segment_try_purge(pmVar11,false);
        _mi_arena_segment_mark_abandoned(pmVar11);
        heap_00 = local_88;
      } while( true );
    }
  }
  goto LAB_0050b2b2;
LAB_0050b275:
  tld = tld_00;
  pmVar11 = mi_segment_reclaim(pmVar11,local_88,local_78,&local_89,tld_00);
  bVar12 = pmVar11 == (mi_segment_t *)0x0;
LAB_0050b298:
  _mi_arena_field_cursor_done(&local_60);
  if ((local_89 & 1U) != 0) {
    return (mi_page_t *)0x0;
  }
  if (!bVar12) goto LAB_0050b2cd;
LAB_0050b2b2:
  tld = (mi_segments_tld_t *)0x0;
  pmVar11 = mi_segment_alloc(0,0,heap_00->arena_id,tld_00,(mi_page_t **)0x0);
  if (pmVar11 == (mi_segment_t *)0x0) {
    return (mi_page_t *)0x0;
  }
LAB_0050b2cd:
  pmVar4 = mi_segments_page_alloc(heap_00,(mi_page_kind_t)local_68,local_78,(size_t)tld_00,tld);
  return pmVar4;
}

Assistant:

static mi_page_t* mi_segments_page_alloc(mi_heap_t* heap, mi_page_kind_t page_kind, size_t required, size_t block_size, mi_segments_tld_t* tld)
{
  mi_assert_internal(required <= MI_LARGE_OBJ_SIZE_MAX && page_kind <= MI_PAGE_LARGE);

  // find a free page
  size_t page_size = _mi_align_up(required, (required > MI_MEDIUM_PAGE_SIZE ? MI_MEDIUM_PAGE_SIZE : MI_SEGMENT_SLICE_SIZE));
  size_t slices_needed = page_size / MI_SEGMENT_SLICE_SIZE;
  mi_assert_internal(slices_needed * MI_SEGMENT_SLICE_SIZE == page_size);
  mi_page_t* page = mi_segments_page_find_and_allocate(slices_needed, heap->arena_id, tld); //(required <= MI_SMALL_SIZE_MAX ? 0 : slices_needed), tld);
  if (page==NULL) {
    // no free page, allocate a new segment and try again
    if (mi_segment_reclaim_or_alloc(heap, slices_needed, block_size, tld) == NULL) {
      // OOM or reclaimed a good page in the heap
      return NULL;
    }
    else {
      // otherwise try again
      return mi_segments_page_alloc(heap, page_kind, required, block_size, tld);
    }
  }
  mi_assert_internal(page != NULL && page->slice_count*MI_SEGMENT_SLICE_SIZE == page_size);
  mi_assert_internal(_mi_ptr_segment(page)->thread_id == _mi_thread_id());
  mi_segment_try_purge(_mi_ptr_segment(page), false);
  return page;
}